

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::exception::exception(exception *this,size_t line,string *file,string *code,string *what)

{
  string *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  exception *in_RDI;
  string *in_R8;
  string *in_stack_000000a0;
  string *in_stack_000000a8;
  size_t in_stack_000000b0;
  string *in_stack_000000b8;
  string local_48 [56];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__exception_003bca88;
  *(undefined8 *)(in_RDI + 8) = local_10;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x30),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x50),in_R8);
  std::__cxx11::string::string((string *)(in_RDI + 0x70));
  compose_what(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x70),local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

exception(std::size_t line, std::string file, std::string code, std::string what) noexcept:
			mLine(line), mFile(std::move(file)), mCode(std::move(code)), mWhat(std::move(what))
		{
			mStr = compose_what(mFile, mLine, mCode, mWhat);
		}